

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcSort.c
# Opt level: O0

Mvc_Cube_t *
Mvc_CoverSort_rec(Mvc_Cube_t *pList,int nItems,Mvc_Cube_t *pMask,
                 _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc)

{
  int nItems_00;
  Mvc_Cube_t *pList1_00;
  Mvc_Cube_t *pList2_00;
  int local_4c;
  int i;
  int nItems2;
  int nItems1;
  Mvc_Cube_t *pList2;
  Mvc_Cube_t *pList1;
  _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc_local;
  Mvc_Cube_t *pMask_local;
  int nItems_local;
  Mvc_Cube_t *pList_local;
  
  if (nItems == 1) {
    pList->pNext = (Mvc_Cube_t *)0x0;
    pList_local = pList;
  }
  else {
    nItems_00 = nItems / 2;
    _nItems2 = pList;
    for (local_4c = 0; local_4c < nItems_00; local_4c = local_4c + 1) {
      _nItems2 = _nItems2->pNext;
    }
    pList1_00 = Mvc_CoverSort_rec(pList,nItems_00,pMask,pCompareFunc);
    pList2_00 = Mvc_CoverSort_rec(_nItems2,nItems - nItems_00,pMask,pCompareFunc);
    pList_local = Mvc_CoverSortMerge(pList1_00,pList2_00,pMask,pCompareFunc);
  }
  return pList_local;
}

Assistant:

Mvc_Cube_t * Mvc_CoverSort_rec( Mvc_Cube_t * pList, int nItems, Mvc_Cube_t * pMask, int (* pCompareFunc)(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *) )
{
    Mvc_Cube_t * pList1, * pList2;
    int nItems1, nItems2, i;

    // trivial case
    if ( nItems == 1 )
    {
        Mvc_CubeSetNext( pList, NULL );
        return pList;
    }

    // select the new sizes
    nItems1 = nItems/2;
    nItems2 = nItems - nItems1;

    // set the new beginnings
    pList1 = pList2 = pList;
    for ( i = 0; i < nItems1; i++ )
        pList2 = Mvc_CubeReadNext( pList2 );

    // solve recursively
    pList1 = Mvc_CoverSort_rec( pList1, nItems1, pMask, pCompareFunc );
    pList2 = Mvc_CoverSort_rec( pList2, nItems2, pMask, pCompareFunc );

    // merge
    return Mvc_CoverSortMerge( pList1, pList2, pMask, pCompareFunc );
}